

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O2

hts_itr_t * hts_itr_query(hts_idx_t *idx,int tid,int beg,int end,hts_readrec_func *readrec)

{
  uint uVar1;
  kh_bin_t *pkVar2;
  bins_t *pbVar3;
  hts_pair64_t *phVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  uint64_t uVar8;
  uint uVar9;
  int iVar10;
  khint_t kVar11;
  hts_itr_t *phVar12;
  int *__ptr;
  hts_pair64_t *a;
  ulong uVar13;
  int iVar14;
  uint64_t *puVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint64_t uVar25;
  int iVar26;
  ulong uVar27;
  undefined4 local_5c;
  
  local_5c = 1;
  if (-1 < tid) {
    if (beg < 1) {
      beg = 0;
    }
    if (end < beg) {
      return (hts_itr_t *)0x0;
    }
    if (idx->n <= tid) {
      return (hts_itr_t *)0x0;
    }
    pkVar2 = idx->bidx[(uint)tid];
    if (pkVar2 == (kh_bin_t *)0x0) {
      return (hts_itr_t *)0x0;
    }
    phVar12 = (hts_itr_t *)calloc(1,0x50);
    phVar12->tid = tid;
    phVar12->beg = beg;
    phVar12->end = end;
    phVar12->i = -1;
    phVar12->readrec = readrec;
    iVar16 = idx->min_shift;
    iVar14 = idx->n_lvls;
    uVar24 = ((uint)beg >> ((byte)iVar16 & 0x1f)) +
             (uint)~(-1 << ((char)iVar14 * '\x03' & 0x1fU)) / 7;
    do {
      uVar9 = kh_get_bin(pkVar2,uVar24);
      kVar11 = pkVar2->n_buckets;
      if (uVar9 != kVar11) {
        if (uVar24 != 0) goto LAB_0010e739;
        break;
      }
      uVar1 = uVar24 - 1;
      bVar6 = (int)((uVar1 & 0xfffffff8) + 1) < (int)uVar24;
      uVar24 = (int)uVar1 >> 3;
      if (bVar6) {
        uVar24 = uVar1;
      }
      kVar11 = uVar9;
    } while (uVar24 != 0);
    uVar9 = kh_get_bin(pkVar2,0);
LAB_0010e739:
    uVar24 = 0;
    if (uVar9 == kVar11) {
      uVar25 = 0;
    }
    else {
      uVar25 = pkVar2->vals[uVar9].loff;
    }
    if (beg < end) {
      iVar16 = iVar16 + iVar14 * 3;
      lVar18 = 1L << ((byte)iVar16 & 0x3f);
      if (end <= lVar18) {
        lVar18 = (long)end;
      }
      __ptr = (int *)0x0;
      iVar22 = 0;
      lVar17 = 0;
      iVar19 = 0;
      for (iVar21 = 0; iVar21 <= iVar14; iVar21 = iVar21 + 1) {
        iVar23 = ((uint)beg >> ((byte)iVar16 & 0x3f)) + iVar19;
        iVar26 = (int)(lVar18 + -1 >> ((byte)iVar16 & 0x3f)) + iVar19;
        iVar10 = iVar26 - iVar23;
        iVar7 = (int)lVar17;
        if (iVar22 < iVar10 + iVar7 + 1) {
          uVar24 = iVar10 + iVar7;
          uVar24 = (int)uVar24 >> 1 | uVar24;
          uVar24 = (int)uVar24 >> 2 | uVar24;
          uVar24 = (int)uVar24 >> 4 | uVar24;
          uVar24 = (int)uVar24 >> 8 | uVar24;
          uVar24 = (int)uVar24 >> 0x10 | uVar24;
          iVar22 = uVar24 + 1;
          (phVar12->bins).m = iVar22;
          __ptr = (int *)realloc(__ptr,(long)(int)uVar24 * 4 + 4);
          (phVar12->bins).a = __ptr;
        }
        lVar17 = (long)iVar7;
        for (; iVar23 <= iVar26; iVar23 = iVar23 + 1) {
          (phVar12->bins).n = (int)(lVar17 + 1);
          __ptr[lVar17] = iVar23;
          lVar17 = lVar17 + 1;
        }
        iVar16 = iVar16 + -3;
        iVar19 = iVar19 + (1 << ((char)iVar21 * '\x03' & 0x1fU));
      }
      uVar24 = (phVar12->bins).n;
    }
    else {
      __ptr = (int *)0x0;
    }
    uVar27 = 0;
    uVar13 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar13 = uVar27;
    }
    iVar16 = 0;
    for (; uVar13 != uVar27; uVar27 = uVar27 + 1) {
      kVar11 = kh_get_bin(pkVar2,__ptr[uVar27]);
      if (kVar11 != pkVar2->n_buckets) {
        iVar16 = iVar16 + pkVar2->vals[kVar11].n;
      }
    }
    if (iVar16 == 0) {
      return phVar12;
    }
    a = (hts_pair64_t *)calloc((long)iVar16,0x10);
    iVar16 = 0;
    for (uVar27 = 0; uVar27 != uVar13; uVar27 = uVar27 + 1) {
      kVar11 = kh_get_bin(pkVar2,__ptr[uVar27]);
      if (kVar11 != pkVar2->n_buckets) {
        pbVar3 = pkVar2->vals;
        iVar14 = pbVar3[kVar11].n;
        lVar18 = 8;
        for (lVar17 = 0; lVar17 < iVar14; lVar17 = lVar17 + 1) {
          phVar4 = pbVar3[kVar11].list;
          if (uVar25 < *(ulong *)((long)&phVar4->u + lVar18)) {
            puVar15 = (uint64_t *)((long)&phVar4->u + lVar18);
            lVar20 = (long)iVar16;
            iVar16 = iVar16 + 1;
            uVar8 = *puVar15;
            a[lVar20].u = puVar15[-1];
            a[lVar20].v = uVar8;
          }
          lVar18 = lVar18 + 0x10;
        }
      }
    }
    if (iVar16 == 0) {
      free(a);
      return phVar12;
    }
    ks_introsort__off((long)iVar16,a);
    puVar15 = &a[1].v;
    uVar24 = 0;
    for (lVar18 = 1; lVar18 < iVar16; lVar18 = lVar18 + 1) {
      uVar9 = uVar24;
      if (a[(int)uVar24].v < *puVar15) {
        uVar9 = uVar24 + 1;
        uVar13 = *puVar15;
        a[(long)(int)uVar24 + 1].u = ((hts_pair64_t *)(puVar15 + -1))->u;
        a[(long)(int)uVar24 + 1].v = uVar13;
      }
      puVar15 = puVar15 + 2;
      uVar24 = uVar9;
    }
    uVar27 = 0;
    uVar13 = (ulong)uVar24;
    if ((int)uVar24 < 1) {
      uVar13 = uVar27;
    }
    for (; uVar13 << 4 != uVar27; uVar27 = uVar27 + 0x10) {
      uVar5 = *(ulong *)((long)&a[1].u + uVar27);
      if (uVar5 <= *(ulong *)((long)&a->v + uVar27)) {
        *(ulong *)((long)&a->v + uVar27) = uVar5;
      }
    }
    iVar16 = 0;
    for (lVar18 = 0; uVar13 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
      if ((*(ulong *)((long)&a[1].u + lVar18) ^ a[iVar16].v) < 0x10000) {
        a[iVar16].v = *(uint64_t *)((long)&a[1].v + lVar18);
        iVar14 = iVar16;
      }
      else {
        iVar14 = iVar16 + 1;
        uVar25 = *(uint64_t *)((long)&a[1].v + lVar18);
        a[(long)iVar16 + 1].u = *(uint64_t *)((long)&a[1].u + lVar18);
        a[(long)iVar16 + 1].v = uVar25;
      }
      iVar16 = iVar14;
    }
    phVar12->n_off = iVar16 + 1;
    phVar12->off = a;
    return phVar12;
  }
  uVar25 = 0;
  switch(tid) {
  case -5:
    local_5c = 3;
    uVar25 = 0;
  case -4:
    goto switchD_0010e651_caseD_fffffffc;
  case -3:
    uVar27 = 0;
    uVar13 = (ulong)(uint)idx->n;
    if (idx->n < 1) {
      uVar13 = uVar27;
    }
    uVar25 = 0xffffffffffffffff;
    for (; uVar13 != uVar27; uVar27 = uVar27 + 1) {
      pkVar2 = idx->bidx[uVar27];
      kVar11 = kh_get_bin(pkVar2,idx->n_bins + 1);
      if ((kVar11 != pkVar2->n_buckets) && (uVar5 = (pkVar2->vals[kVar11].list)->u, uVar5 <= uVar25)
         ) {
        uVar25 = uVar5;
      }
    }
LAB_0010e6e8:
    if (uVar25 != 0xffffffffffffffff) goto switchD_0010e651_caseD_fffffffc;
    break;
  case -2:
    if (0 < (long)idx->n) {
      pkVar2 = idx->bidx[(long)idx->n + -1];
      kVar11 = kh_get_bin(pkVar2,idx->n_bins + 1);
      if (kVar11 != pkVar2->n_buckets) {
        uVar25 = (pkVar2->vals[kVar11].list)->v;
        goto LAB_0010e6e8;
      }
    }
    break;
  default:
    goto LAB_0010e718;
  }
  uVar25 = 0;
  if (idx->n_no_coor == 0) {
LAB_0010e718:
    return (hts_itr_t *)0x0;
  }
switchD_0010e651_caseD_fffffffc:
  phVar12 = (hts_itr_t *)calloc(1,0x50);
  *(undefined4 *)phVar12 = local_5c;
  phVar12->curr_off = uVar25;
  phVar12->readrec = readrec;
  return phVar12;
}

Assistant:

hts_itr_t *hts_itr_query(const hts_idx_t *idx, int tid, int beg, int end, hts_readrec_func *readrec)
{
    int i, n_off, l, bin;
    hts_pair64_t *off;
    khint_t k;
    bidx_t *bidx;
    uint64_t min_off;
    hts_itr_t *iter = 0;
    if (tid < 0) {
        int finished0 = 0;
        uint64_t off0 = (uint64_t)-1;
        khint_t k;
        switch (tid) {
        case HTS_IDX_START:
            // Find the smallest offset, note that sequence ids may not be ordered sequentially
            for (i=0; i<idx->n; i++)
            {
                bidx = idx->bidx[i];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k == kh_end(bidx)) continue;
                if ( off0 > kh_val(bidx, k).list[0].u ) off0 = kh_val(bidx, k).list[0].u;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_NOCOOR:
            if ( idx->n>0 )
            {
                bidx = idx->bidx[idx->n - 1];
                k = kh_get(bin, bidx, META_BIN(idx));
                if (k != kh_end(bidx)) off0 = kh_val(bidx, k).list[0].v;
            }
            if ( off0==(uint64_t)-1 && idx->n_no_coor ) off0 = 0; // only no-coor reads in this bam
            break;

        case HTS_IDX_REST:
            off0 = 0;
            break;

        case HTS_IDX_NONE:
            finished0 = 1;
            off0 = 0;
            break;

        default:
            return 0;
        }
        if (off0 != (uint64_t)-1) {
            iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
            iter->read_rest = 1;
            iter->finished = finished0;
            iter->curr_off = off0;
            iter->readrec = readrec;
            return iter;
        } else return 0;
    }

    if (beg < 0) beg = 0;
    if (end < beg) return 0;
    if (tid >= idx->n || (bidx = idx->bidx[tid]) == NULL) return 0;

    iter = (hts_itr_t*)calloc(1, sizeof(hts_itr_t));
    iter->tid = tid, iter->beg = beg, iter->end = end; iter->i = -1;
    iter->readrec = readrec;

    // compute min_off
    bin = hts_bin_first(idx->n_lvls) + (beg>>idx->min_shift);
    do {
        int first;
        k = kh_get(bin, bidx, bin);
        if (k != kh_end(bidx)) break;
        first = (hts_bin_parent(bin)<<3) + 1;
        if (bin > first) --bin;
        else bin = hts_bin_parent(bin);
    } while (bin);
    if (bin == 0) k = kh_get(bin, bidx, bin);
    min_off = k != kh_end(bidx)? kh_val(bidx, k).loff : 0;
    // retrieve bins
    reg2bins(beg, end, iter, idx->min_shift, idx->n_lvls);
    for (i = n_off = 0; i < iter->bins.n; ++i)
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx))
            n_off += kh_value(bidx, k).n;
    if (n_off == 0) return iter;
    off = (hts_pair64_t*)calloc(n_off, sizeof(hts_pair64_t));
    for (i = n_off = 0; i < iter->bins.n; ++i) {
        if ((k = kh_get(bin, bidx, iter->bins.a[i])) != kh_end(bidx)) {
            int j;
            bins_t *p = &kh_value(bidx, k);
            for (j = 0; j < p->n; ++j)
                if (p->list[j].v > min_off) off[n_off++] = p->list[j];
        }
    }
    if (n_off == 0) {
        free(off); return iter;
    }
    ks_introsort(_off, n_off, off);
    // resolve completely contained adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i)
        if (off[l].v < off[i].v) off[++l] = off[i];
    n_off = l + 1;
    // resolve overlaps between adjacent blocks; this may happen due to the merge in indexing
    for (i = 1; i < n_off; ++i)
        if (off[i-1].v >= off[i].u) off[i-1].v = off[i].u;
    // merge adjacent blocks
    for (i = 1, l = 0; i < n_off; ++i) {
        if (off[l].v>>16 == off[i].u>>16) off[l].v = off[i].v;
        else off[++l] = off[i];
    }
    n_off = l + 1;
    iter->n_off = n_off; iter->off = off;
    return iter;
}